

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_ManReorderModels(Au_Man_t *p,Au_Ntk_t *pRoot)

{
  Vec_Ptr_t *p_00;
  int *piVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  Vec_Int_t *p_01;
  ulong uVar6;
  Vec_Ptr_t *p_02;
  Vec_Int_t *p_03;
  long lVar7;
  Au_Ntk_t *pAVar8;
  Au_Obj_t *pAVar9;
  Au_Obj_t *pAVar10;
  Au_Ntk_t *pAVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  p_00 = &p->vNtks;
  for (iVar14 = 1; iVar13 = (p->vNtks).nSize, iVar14 < iVar13; iVar14 = iVar14 + 1) {
    pvVar5 = Vec_PtrEntry(p_00,iVar14);
    *(undefined4 *)((long)pvVar5 + 200) = 0;
  }
  p_01 = Vec_IntAlloc(iVar13);
  Vec_IntPush(p_01,0);
  Au_ManReorderModels_rec(pRoot,p_01);
  iVar14 = p_01->nSize;
  if ((long)iVar14 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  if (p_01->pArray[(long)iVar14 + -1] != pRoot->Id) {
    __assert_fail("Vec_IntEntryLast(vOrder) == pRoot->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x1b7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  p_01->nSize = iVar14 + -1;
  for (iVar14 = 1; iVar14 < (p->vNtks).nSize; iVar14 = iVar14 + 1) {
    pvVar5 = Vec_PtrEntry(p_00,iVar14);
    if (*(int *)((long)pvVar5 + 200) == 0) {
      Vec_IntPush(p_01,*(int *)((long)pvVar5 + 0x10));
    }
  }
  Vec_IntPush(p_01,pRoot->Id);
  iVar14 = p_01->nSize;
  if (iVar14 != (p->vNtks).nSize) {
    __assert_fail("Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x1be,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  piVar1 = p_01->pArray;
  uVar2 = (long)(iVar14 + -1) / 2;
  uVar6 = uVar2 & 0xffffffff;
  uVar12 = 0;
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  iVar13 = iVar14 + -2;
  for (; uVar6 != uVar12; uVar12 = uVar12 + 1) {
    iVar15 = piVar1[uVar12 + 1];
    piVar1[uVar12 + 1] = piVar1[(long)iVar13 + 1];
    piVar1[(long)iVar13 + 1] = iVar15;
    iVar13 = iVar13 + -1;
  }
  p_01->pArray = piVar1;
  p_02 = Vec_PtrAlloc((p->vNtks).nSize);
  iVar13 = 0;
  iVar15 = 0;
  if (0 < iVar14) {
    iVar13 = iVar14;
    iVar15 = 0;
  }
  for (; iVar13 != iVar15; iVar15 = iVar15 + 1) {
    iVar3 = Vec_IntEntry(p_01,iVar15);
    pvVar5 = Vec_PtrEntry(p_00,iVar3);
    Vec_PtrPush(p_02,pvVar5);
  }
  iVar15 = Vec_IntEntry(p_01,1);
  if (iVar15 != pRoot->Id) {
    __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x1ca,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  p_03 = Vec_IntAlloc(0);
  if (iVar14 != 0) {
    iVar15 = *piVar1;
    for (lVar7 = 1; lVar7 < iVar14; lVar7 = lVar7 + 1) {
      if (iVar15 <= piVar1[lVar7]) {
        iVar15 = piVar1[lVar7];
      }
    }
    Vec_IntFill(p_03,iVar15 + 1,0);
    for (iVar14 = 0; iVar13 != iVar14; iVar14 = iVar14 + 1) {
      iVar15 = Vec_IntEntry(p_01,iVar14);
      if (iVar15 != 0) {
        Vec_IntWriteEntry(p_03,iVar15,iVar14);
      }
    }
  }
  Vec_IntFree(p_01);
  iVar14 = 1;
  iVar13 = Vec_IntEntry(p_03,1);
  if (iVar13 != pRoot->Id) {
    __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x1cd,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  for (; iVar14 < (p->vNtks).nSize; iVar14 = iVar14 + 1) {
    pAVar8 = (Au_Ntk_t *)Vec_PtrEntry(p_00,iVar14);
    iVar13 = Vec_IntEntry(p_03,pAVar8->Id);
    pAVar8->Id = iVar13;
    for (iVar13 = 0; iVar13 < (pAVar8->vObjs).nSize; iVar13 = iVar13 + 1) {
      pAVar9 = Au_NtkObjI(pAVar8,iVar13);
      if ((*(ulong *)pAVar9 & 0x700000000) == 0x600000000) {
        uVar4 = Vec_IntEntry(p_03,(uint)*(ulong *)pAVar9 & 0x3fffffff);
        *(ulong *)pAVar9 = *(ulong *)pAVar9 & 0xffffffffc0000000 | (ulong)(uVar4 & 0x3fffffff);
        if ((uVar4 & 0x3fffffff) == 0) {
          __assert_fail("pBox->Func > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                        ,0x1d5,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
        }
        for (iVar15 = 0; iVar3 = Au_BoxFanoutNum(pAVar9), iVar15 < iVar3; iVar15 = iVar15 + 1) {
          pAVar10 = Au_BoxFanout(pAVar9,iVar15);
          *(ulong *)pAVar10 =
               *(ulong *)pAVar10 & 0xffffffffc0000000 |
               (ulong)((uint)*(undefined8 *)pAVar9 & 0x3fffffff);
        }
      }
    }
  }
  free((p->vNtks).pArray);
  (p->vNtks).pArray = p_02->pArray;
  p_02->pArray = (void **)0x0;
  Vec_PtrFree(p_02);
  iVar14 = 1;
  do {
    if ((p->vNtks).nSize <= iVar14) {
      Vec_IntFree(p_03);
      return;
    }
    pAVar8 = (Au_Ntk_t *)Vec_PtrEntry(p_00,iVar14);
    for (iVar13 = 0; iVar13 < (pAVar8->vObjs).nSize; iVar13 = iVar13 + 1) {
      pAVar9 = Au_NtkObjI(pAVar8,iVar13);
      if ((((undefined1  [16])*pAVar9 & (undefined1  [16])0x700000000) ==
           (undefined1  [16])0x600000000) &&
         (pAVar11 = Au_ObjModel(pAVar9), pAVar11 != pAVar8 && pAVar11 != (Au_Ntk_t *)0x0)) {
        uVar2 = *(ulong *)pAVar9;
        if (((uVar2 & 0x3fffffff) != 0) && (((uint)uVar2 & 0x3fffffff) < (uint)pAVar8->Id)) {
          __assert_fail("!pBox->Func || pBox->Func >= (unsigned)pNtk->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                        ,0x1e6,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
        }
        if (pAVar11->nObjs[2] != (uint)(uVar2 >> 0x23)) {
          __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                        ,0x1e7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
        }
        iVar15 = Au_BoxFanoutNum(pAVar9);
        if (iVar15 != pAVar11->nObjs[3]) {
          __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                        ,0x1e8,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
        }
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

void Au_ManReorderModels( Au_Man_t * p, Au_Ntk_t * pRoot )
{
    Vec_Ptr_t * vNtksNew;
    Vec_Int_t * vOrder, * vTemp;
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox, * pFan;
    int i, k, j, Entry;
    Au_ManForEachNtk( p, pNtk, i )
        pNtk->fMark = 0;
    // collect networks in the DFS order
    vOrder = Vec_IntAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntPush( vOrder, 0 );
    Au_ManReorderModels_rec( pRoot, vOrder );
    assert( Vec_IntEntryLast(vOrder) == pRoot->Id );
    // add unconnected ones
    Vec_IntPop( vOrder );
    Au_ManForEachNtk( p, pNtk, i )
        if ( pNtk->fMark == 0 )
            Vec_IntPush( vOrder, pNtk->Id );
    Vec_IntPush( vOrder, pRoot->Id );
    assert( Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1 );
    // reverse order
    vOrder->nSize--;
    vOrder->pArray++;
    Vec_IntReverseOrder( vOrder ); 
    vOrder->pArray--;
    vOrder->nSize++;
    // compute new order
    vNtksNew = Vec_PtrAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_PtrPush( vNtksNew, Au_ManNtk(p, Entry) );
    // invert order
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    vOrder = Vec_IntInvert( vTemp = vOrder, 0 );
    Vec_IntFree( vTemp );
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    // update model numbers
    Au_ManForEachNtk( p, pNtk, i )
    {
        pNtk->Id = Vec_IntEntry( vOrder, pNtk->Id );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBox->Func = Vec_IntEntry( vOrder, pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    }
    // update
    ABC_FREE( p->vNtks.pArray );
    p->vNtks.pArray = vNtksNew->pArray;
    vNtksNew->pArray = NULL;
    Vec_PtrFree( vNtksNew );
    // verify
    Au_ManForEachNtk( p, pNtk, i )
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( !pBox->Func || pBox->Func >= (unsigned)pNtk->Id );
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
        }
    Vec_IntFree( vOrder );
}